

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O3

size_t __thiscall osc::OutboundPacketStream::Size(OutboundPacketStream *this)

{
  size_t sVar1;
  
  sVar1 = (long)this->argumentCurrent_ - (long)this->data_;
  if (this->messageIsInProgress_ == true) {
    sVar1 = sVar1 + ((ulong)(this->end_ + (5 - (long)this->typeTagsCurrent_)) & 0xfffffffffffffffc);
  }
  return sVar1;
}

Assistant:

std::size_t OutboundPacketStream::Size() const
{
    std::size_t result = argumentCurrent_ - data_;
    if( IsMessageInProgress() ){
        // account for the length of the type tag string. the total type tag
        // includes an initial comma, plus at least one terminating \0
        result += RoundUp4( (end_ - typeTagsCurrent_) + 2 );
    }

    return result;
}